

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

int __thiscall
CVmObject::getp_get_prop_params
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_4,
          vm_obj_id_t *param_5)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  CVmObjPageEntry *this_00;
  int varargs;
  int opt_args;
  int min_args;
  vm_val_t val;
  
  if (getp_get_prop_params(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc
      == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_get_prop_params(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                 ::desc);
    if (iVar3 != 0) {
      getp_get_prop_params::desc.min_argc_ = 1;
      getp_get_prop_params::desc.opt_argc_ = 0;
      getp_get_prop_params::desc.varargs_ = 0;
      __cxa_guard_release(&getp_get_prop_params(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                           ::desc);
    }
  }
  iVar3 = get_prop_check_argc(retval,argc,&getp_get_prop_params::desc);
  if (iVar3 == 0) {
    CVmRun::pop_prop(&G_interpreter_X,&val);
    pvVar2 = sp_;
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = self;
    get_prop_interface(this,self,val.val.prop,&min_args,&opt_args,&varargs);
    vVar4 = CVmObjList::create(0,3);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar4;
    this_00 = G_obj_table_X.pages_[vVar4 >> 0xc] + (vVar4 & 0xfff);
    val.val.intval = min_args;
    val.typ = VM_INT;
    CVmObjList::cons_set_element((CVmObjList *)this_00,0,&val);
    val.val.intval = opt_args;
    val.typ = VM_INT;
    CVmObjList::cons_set_element((CVmObjList *)this_00,1,&val);
    val.typ = VM_TRUE - (varargs == 0);
    CVmObjList::cons_set_element((CVmObjList *)this_00,2,&val);
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObject::getp_get_prop_params(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc,
                                    vm_prop_id_t, vm_obj_id_t *)
{
    vm_val_t val;
    vm_prop_id_t prop;
    int min_args, opt_args, varargs;
    static CVmNativeCodeDesc desc(1);
    CVmObjList *lst;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the property address to test */
    G_interpreter->pop_prop(vmg_ &val);
    prop = val.val.prop;

    /* push a self-reference while we're working */
    G_stk->push()->set_obj(self);

    /* get the property information */
    get_prop_interface(vmg_ self, prop, min_args, opt_args, varargs);

    /* 
     *   Allocate our return list.  We need three elements: [minArgs,
     *   optionalArgs, isVarargs]. 
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 3));

    /* get the list object, properly cast */
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* set the minimum argument count */
    val.set_int(min_args);
    lst->cons_set_element(0, &val);

    /* set the optional argument count */
    val.set_int(opt_args);
    lst->cons_set_element(1, &val);

    /* set the varargs flag */
    val.set_logical(varargs);
    lst->cons_set_element(2, &val);

    /* discard our self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}